

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_sgrproj_filter(SgrprojInfo *sgrproj_info,SgrprojInfo *ref_sgrproj_info,aom_writer *wb)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = sgrproj_info->ep;
  uVar3 = 5;
  do {
    od_ec_encode_bool_q15(&wb->ec,(uint)((uVar1 >> (uVar3 - 2 & 0x1f) & 1) != 0),0x4000);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  iVar2 = sgrproj_info->ep;
  if (av1_sgr_params[iVar2].r[0] != 0) {
    aom_write_primitive_refsubexpfin
              (wb,0x80,4,(short)ref_sgrproj_info->xqd[0] + 0x60,(short)sgrproj_info->xqd[0] + 0x60);
    if (av1_sgr_params[iVar2].r[1] == 0) goto LAB_00197d96;
  }
  aom_write_primitive_refsubexpfin
            (wb,0x80,4,(short)ref_sgrproj_info->xqd[1] + 0x20,(short)sgrproj_info->xqd[1] + 0x20);
LAB_00197d96:
  ref_sgrproj_info->xqd[1] = sgrproj_info->xqd[1];
  iVar2 = sgrproj_info->xqd[0];
  ref_sgrproj_info->ep = sgrproj_info->ep;
  ref_sgrproj_info->xqd[0] = iVar2;
  return;
}

Assistant:

static inline void write_sgrproj_filter(const SgrprojInfo *sgrproj_info,
                                        SgrprojInfo *ref_sgrproj_info,
                                        aom_writer *wb) {
  aom_write_literal(wb, sgrproj_info->ep, SGRPROJ_PARAMS_BITS);
  const sgr_params_type *params = &av1_sgr_params[sgrproj_info->ep];

  if (params->r[0] == 0) {
    assert(sgrproj_info->xqd[0] == 0);
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1,
        sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1);
  } else if (params->r[1] == 0) {
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0,
        sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0);
  } else {
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0,
        sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0);
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1,
        sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1);
  }

  memcpy(ref_sgrproj_info, sgrproj_info, sizeof(*sgrproj_info));
}